

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.hpp
# Opt level: O0

Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
__thiscall
rc::gen::detail::
ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
::generate<char>(ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
                 *this,Random *random,int size,Gen<char> *gens)

{
  Number NVar1;
  undefined4 in_register_00000014;
  size_t *psVar2;
  Gen<char> *in_R8;
  Random *this_00;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>_ptr
  *local_138 [3];
  anon_class_1_1_527bc8f1 local_119;
  Shrinkable<std::vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>_> local_118;
  undefined1 local_110 [8];
  Shrinkables<char> shrinkables;
  size_t count;
  Random r;
  CollectionStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_31;
  Gen<char> *pGStack_30;
  GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  strategy;
  Gen<char> *gens_local;
  int size_local;
  Random *random_local;
  ContainerHelper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_rc::gen::detail::GenericContainerStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>_>
  *this_local;
  
  psVar2 = (size_t *)CONCAT44(in_register_00000014,size);
  r.m_counter = psVar2[10];
  r.m_block._M_elems[3] = psVar2[8];
  r.m_bits = psVar2[9];
  count = *psVar2;
  r.m_key._M_elems[0] = psVar2[1];
  r.m_key._M_elems[1] = psVar2[2];
  r.m_key._M_elems[2] = psVar2[3];
  r.m_key._M_elems[3] = psVar2[4];
  r.m_block._M_elems[0] = psVar2[5];
  r.m_block._M_elems[1] = psVar2[6];
  r.m_block._M_elems[2] = psVar2[7];
  this_00 = (Random *)this;
  pGStack_30 = in_R8;
  Random::split((Random *)
                &shrinkables.
                 super__Vector_base<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
  NVar1 = Random::next(this_00);
  CollectionStrategy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::generateElements<char>
            ((Shrinkables<char> *)local_110,&local_31,(Random *)&count,(int)gens,
             NVar1 % (ulong)(long)((int)gens + 1),pGStack_30);
  rc::shrinkable::
  shrinkRecur<std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>,rc::gen::detail::ContainerHelper<std::__cxx11::string,rc::gen::detail::GenericContainerStrategy<std::__cxx11::string,false,false>>::generate<char>(rc::Random_const&,int,rc::Gen<char>const&)const::_lambda(std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>const&)_1_>
            ((shrinkable *)&local_118,(Shrinkables<char> *)local_110,&local_119);
  local_138[0] = toContainer<std::__cxx11::string,char>;
  rc::shrinkable::
  map<std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>,std::__cxx11::string(*)(std::vector<rc::Shrinkable<char>,std::allocator<rc::Shrinkable<char>>>const&)>
            ((shrinkable *)this_00,&local_118,local_138);
  Shrinkable<std::vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>_>::
  ~Shrinkable(&local_118);
  std::vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_>::~vector
            ((vector<rc::Shrinkable<char>,_std::allocator<rc::Shrinkable<char>_>_> *)local_110);
  return (Shrinkable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          )(IShrinkableImpl *)this;
}

Assistant:

Shrinkable<Container>
  generate(const Random &random, int size, const Gen<Ts> &... gens) const {
    const auto strategy = m_strategy;
    auto r = random;
    std::size_t count = r.split().next() % (size + 1);
    auto shrinkables = strategy.generateElements(r, size, count, gens...);

    using Elements = decltype(shrinkables);
    return shrinkable::map(
        shrinkable::shrinkRecur(std::move(shrinkables),
                                [=](const Elements &elements) {
                                  return seq::concat(
                                      shrink::removeChunks(elements),
                                      strategy.shrinkElements(elements));
                                }),
        &toContainer<Container, typename Elements::value_type::ValueType>);
  }